

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall
HModel::util_addRows
          (HModel *this,int nrows,double *XrowLower,double *XrowUpper,int nnonz,int *XARstart,
          int *XARindex,double *XARvalue)

{
  long lVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer piVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  undefined4 in_register_00000034;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  size_type sVar14;
  long lVar15;
  vector<int,_std::allocator<int>_> Alength;
  value_type local_4c;
  vector<int,_std::allocator<int>_> local_48;
  
  printf("Called model.util_addRows(nrows=%d, nnonz = %d)\n",CONCAT44(in_register_00000034,nrows),
         (ulong)(uint)nnonz);
  std::ostream::flush();
  puts("H2DEBUG is being set OK");
  printf("Called model.util_addRows(nrows=%d, nnonz = %d)\n",(ulong)(uint)nrows,nnonz);
  std::ostream::flush();
  if (nrows != 0) {
    sVar14 = (long)nrows + (long)this->numRow;
    std::vector<double,_std::allocator<double>_>::resize(&this->rowLower,sVar14);
    std::vector<double,_std::allocator<double>_>::resize(&this->rowUpper,sVar14);
    std::vector<double,_std::allocator<double>_>::resize(&this->rowScale,sVar14);
    if (0 < nrows) {
      lVar9 = (long)this->numRow;
      pdVar2 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = 0;
      do {
        pdVar2[lVar9 + uVar10] = XrowLower[uVar10];
        pdVar3[lVar9 + uVar10] = XrowUpper[uVar10];
        pdVar4[lVar9 + uVar10] = 1.0;
        uVar10 = uVar10 + 1;
      } while ((uint)nrows != uVar10);
    }
    if (0 < nnonz) {
      iVar12 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[this->numCol];
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_4c = 0;
      std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_48,(long)this->numCol,&local_4c)
      ;
      uVar10 = 0;
      do {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[XARindex[uVar10]] =
             local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[XARindex[uVar10]] + 1;
        uVar10 = uVar10 + 1;
      } while ((uint)nnonz != uVar10);
      sVar14 = (long)iVar12 + (long)nnonz;
      std::vector<int,_std::allocator<int>_>::resize(&this->Aindex,sVar14);
      std::vector<double,_std::allocator<double>_>::resize(&this->Avalue,sVar14);
      lVar9 = (long)this->numCol;
      if (0 < lVar9) {
        piVar5 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar12 = piVar5[lVar9];
        do {
          uVar11 = (int)sVar14 -
                   local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar9 + -1];
          iVar8 = piVar5[lVar9 + -1];
          if (piVar5[lVar9 + -1] < iVar12) {
            lVar13 = (long)iVar12;
            lVar15 = 0;
            do {
              piVar6[(long)(int)uVar11 + lVar15 + -1] = piVar6[lVar13 + lVar15 + -1];
              pdVar2[(long)(int)uVar11 + lVar15 + -1] = pdVar2[lVar13 + lVar15 + -1];
              lVar1 = lVar13 + lVar15;
              lVar15 = lVar15 + -1;
            } while ((long)piVar5[lVar9 + -1] < lVar1 + -1);
            uVar11 = uVar11 + (int)lVar15;
            iVar8 = piVar5[lVar9 + -1];
          }
          iVar12 = iVar8;
          piVar5[lVar9] = (int)sVar14;
          sVar14 = (size_type)uVar11;
          bVar7 = 1 < lVar9;
          lVar9 = lVar9 + -1;
        } while (bVar7);
      }
      if (0 < nrows) {
        piVar5 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = 0;
        do {
          iVar12 = nnonz;
          if (uVar10 < nrows - 1) {
            iVar12 = XARstart[uVar10 + 1];
          }
          lVar9 = (long)XARstart[uVar10];
          if (XARstart[uVar10] < iVar12) {
            do {
              lVar13 = (long)XARindex[lVar9];
              lVar15 = (long)piVar5[lVar13 + 1] -
                       (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar13];
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar13] =
                   local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar13] + -1;
              piVar6[lVar15] = this->numRow + (int)uVar10;
              pdVar2[lVar15] = XARvalue[lVar9];
              lVar9 = lVar9 + 1;
            } while (iVar12 != lVar9);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != (uint)nrows);
      }
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    iVar12 = this->numRow;
    this->numRow = iVar12 + nrows;
    this->numTot = this->numTot + nrows;
    extendWithLogicalBasis(this,this->numCol,-1,iVar12,iVar12 + nrows + -1);
  }
  return;
}

Assistant:

void HModel::util_addRows(int nrows, const double* XrowLower, const double* XrowUpper,
			  int nnonz, const int* XARstart, const int* XARindex, const double* XARvalue) {
  assert(nrows >= 0);
  assert(nnonz >= 0);
  assert(nnonz == 0 || numCol > 0);
#ifdef JAJH_dev
  printf("Called model.util_addRows(nrows=%d, nnonz = %d)\n", nrows, nnonz);cout << flush;
#endif

#ifdef H2DEBUG
  printf("H2DEBUG is being set OK\n");
  printf("Called model.util_addRows(nrows=%d, nnonz = %d)\n", nrows, nnonz);cout << flush;
#endif


  if (nrows==0) return;

  int nwNumRow = numRow + nrows;
  rowLower.resize(nwNumRow);
  rowUpper.resize(nwNumRow);
  rowScale.resize(nwNumRow);

  for (int row = 0; row < nrows; row++) {
    rowLower[numRow+row] = XrowLower[row];
    rowUpper[numRow+row] = XrowUpper[row];
    rowScale[numRow+row] = 1.0;
  }
  //NB SCIP doesn't have XARstart[nrows] defined, so have to use nnonz for last entry
  if (nnonz > 0) {
    int cuNnonz = Astart[numCol];
    vector<int> Alength;
    Alength.assign(numCol, 0);
    for (int el = 0; el < nnonz; el++) {
      int col = XARindex[el];
      //      printf("El %2d: adding entry in column %2d\n", el, col); cout << flush;
#ifdef H2DEBUG
      assert(col >= 0);
      assert(col < numCol);
#endif
      Alength[col]++;
    }
    //Determine the new number of nonzeros and resize the column-wise matrix arrays
    int nwNnonz = cuNnonz + nnonz;
    Aindex.resize(nwNnonz);
    Avalue.resize(nwNnonz);

    //Add the new rows
    //Shift the existing columns to make space for the new entries
    int nwEl = nwNnonz;
    for (int col = numCol-1; col >= 0; col--) {
      //printf("Column %2d has additional length %2d\n", col, Alength[col]);cout << flush;
      int AstartColp1 = nwEl;
      nwEl -= Alength[col];
      //printf("Shift: nwEl = %2d\n", nwEl); cout << flush;
      for (int el = Astart[col+1]-1; el >= Astart[col]; el--) {
	nwEl--;
	//printf("Shift: Over-writing Aindex[%2d] with Aindex[%2d]=%2d\n", nwEl, el, Aindex[el]); cout << flush;
	Aindex[nwEl] = Aindex[el];
	Avalue[nwEl] = Avalue[el];
      }
      Astart[col+1] = AstartColp1;
    }
    //printf("After shift: nwEl = %2d\n", nwEl); cout << flush;
    assert(nwEl == 0);
    //util_reportColMtx(numCol, Astart, Aindex, Avalue);

    //Insert the new entries
    for (int row = 0; row < nrows; row++) {
      int fEl = XARstart[row];
      int lEl = (row < nrows-1 ? XARstart[row+1] : nnonz) - 1;
      for (int el = fEl; el <= lEl; el++) {
	int col = XARindex[el];
	nwEl = Astart[col+1]-Alength[col];
	Alength[col]--;
	//printf("Insert: row = %2d; col = %2d; Astart[col+1]-Alength[col] = %2d; Alength[col] = %2d; nwEl = %2d\n", row, col, Astart[col+1]-Alength[col], Alength[col], nwEl); cout << flush;
	assert(nwEl >= 0);
	assert(el >= 0);
	//printf("Insert: Over-writing Aindex[%2d] with Aindex[%2d]=%2d\n", nwEl, el, Aindex[el]); cout << flush;
	Aindex[nwEl] = numRow + row;
	Avalue[nwEl] = XARvalue[el];
      }
    }
  }
  //Increase the number of rows and total number of variables in the model
  numRow += nrows;
  numTot += nrows;

  //Update the basis and work vectors correponding to new basic rows
  extendWithLogicalBasis(numCol, -1, numRow-nrows, numRow-1);

}